

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O0

void __thiscall AutoArgParse::FlagStore::printUsageSummary(FlagStore *this,ostream *os)

{
  bool bVar1;
  uint uVar2;
  reference this_00;
  pointer pAVar3;
  reference __k;
  mapped_type *this_01;
  pointer pFVar4;
  mapped_type *flagObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  const_iterator __end1;
  const_iterator __begin1;
  ArgVector *__range1;
  ostream *os_local;
  FlagStore *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ::begin(&this->args);
  argPtr = (unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *)
           std::
           vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ::end(&this->args);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
                                *)&argPtr);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
              ::operator*(&__end1);
    std::operator<<(os," ");
    pAVar3 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
             operator->(this_00);
    if ((pAVar3->super_ParseToken).policy == OPTIONAL) {
      std::operator<<(os,"[");
    }
    pAVar3 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
             operator->(this_00);
    std::operator<<(os,(string *)&pAVar3->name);
    pAVar3 = std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>::
             operator->(this_00);
    if ((pAVar3->super_ParseToken).policy == OPTIONAL) {
      std::operator<<(os,"]");
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_*,_std::vector<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((const_iterator *)&__end1_1._M_node,&this->flagInsertionOrder);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end((const_iterator *)&flag,&this->flagInsertionOrder);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1_1._M_node,(_Self *)&flag);
    if (!bVar1) break;
    __k = std::
          _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                       *)&__end1_1._M_node);
    this_01 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>_>
              ::at(&this->flags,__k);
    std::operator<<(os," ");
    pFVar4 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
             operator->(this_01);
    if ((pFVar4->super_ParseToken).policy == OPTIONAL) {
      std::operator<<(os,"[");
    }
    pFVar4 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
             operator->(this_01);
    uVar2 = (*(pFVar4->super_ParseToken)._vptr_ParseToken[5])();
    if ((uVar2 & 1) == 0) {
      std::operator<<(os,(string *)__k);
    }
    pFVar4 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
             operator->(this_01);
    (*(pFVar4->super_ParseToken)._vptr_ParseToken[4])(pFVar4,os);
    pFVar4 = std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>::
             operator->(this_01);
    if ((pFVar4->super_ParseToken).policy == OPTIONAL) {
      std::operator<<(os,"]");
    }
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)&__end1_1._M_node);
  }
  return;
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::printUsageSummary(std::ostream& os) const {
    for (auto& argPtr : args) {
        os << " ";
        if (argPtr->policy == Policy::OPTIONAL) {
            os << "[";
        }
        os << argPtr->name;
        if (argPtr->policy == Policy::OPTIONAL) {
            os << "]";
        }
    }
    for (const auto& flag : flagInsertionOrder) {
        auto& flagObj = flags.at(flag);
        os << " ";

        if (flagObj->policy == Policy::OPTIONAL) {
            os << "[";
        }
        if (!flagObj->isExclusiveGroup()) {
            os << flag;
        }
        flagObj->printUsageSummary(os);
        if (flagObj->policy == Policy::OPTIONAL) {
            os << "]";
        }
    }
}